

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O0

void __thiscall mod_verify::ModVerifyTest1<short>::ModVerifyTest1(ModVerifyTest1<short> *this)

{
  ostream *poVar1;
  short in_stack_0000000e;
  SafeIntException *anon_var_0_1;
  short r_1;
  SafeIntException *anon_var_0;
  short r;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  bool divzero;
  bool expected;
  size_t shift;
  size_t width;
  int *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe56;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  string *psVar2;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [44];
  undefined2 local_ac;
  short local_aa;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [62];
  undefined2 local_2a;
  short local_28;
  short local_26;
  undefined4 local_24;
  undefined2 local_20;
  short local_1e;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_1c;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 2;
  local_18 = 0xf;
  local_19 = 1;
  local_1e = -0x8000;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_1c,&local_1e);
  local_24 = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48);
  local_2a = local_20;
  local_28 = (short)SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    ::operator%(in_stack_fffffffffffffe58,
                                (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                 )(short)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  rhs.m_int = (short)((ulong)in_stack_fffffffffffffe60 >> 0x30);
  local_26 = SafeInt::operator_cast_to_short
                       ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50));
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<short>();
  poVar1 = std::operator<<(poVar1,local_68);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_68);
  SafeInt::operator_cast_to_short
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50));
  to_hex<short>(in_stack_0000000e);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_88);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_short
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50));
  to_hex<short>(in_stack_0000000e);
  poVar1 = std::operator<<(poVar1,local_a8);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_aa = SafeInt::operator_cast_to_short
                       ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50));
  local_ac = local_20;
  operator%=(&in_stack_fffffffffffffe58->m_int,rhs);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<short>();
  poVar1 = std::operator<<(poVar1,local_d8);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_d8);
  SafeInt::operator_cast_to_short
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50));
  psVar2 = local_f8;
  to_hex<short>(in_stack_0000000e);
  poVar1 = std::operator<<((ostream *)&std::cerr,psVar2);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_short
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50));
  to_hex<short>(in_stack_0000000e);
  poVar1 = std::operator<<(poVar1,local_118);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}